

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# directories.cpp
# Opt level: O2

string * directories::MADPGetResultsFilename
                   (string *__return_storage_ptr__,string *method,
                   MultiAgentDecisionProcessInterface *problem,Arguments *args)

{
  string sStack_a8;
  string local_88;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_68;
  string local_48;
  
  MADPGetResultsDir(&local_48,method,problem);
  std::operator+(&local_68,&local_48,"/");
  (*problem->_vptr_MultiAgentDecisionProcessInterface[4])(&sStack_a8,problem);
  MADPGetResultsBaseFilename(&local_88,method,&sStack_a8,args);
  std::operator+(__return_storage_ptr__,&local_68,&local_88);
  std::__cxx11::string::~string((string *)&local_88);
  std::__cxx11::string::~string((string *)&sStack_a8);
  std::__cxx11::string::~string((string *)&local_68);
  std::__cxx11::string::~string((string *)&local_48);
  return __return_storage_ptr__;
}

Assistant:

string
directories::MADPGetResultsFilename(const string & method,
                                    const 
                                    MultiAgentDecisionProcessInterface &problem,
                                    const ArgumentHandlers::Arguments &args)
{
    return(MADPGetResultsDir(method,problem) + "/" +
           MADPGetResultsBaseFilename(method,problem.GetUnixName(),
                                      args));
}